

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * NewToken(TidyDocImpl *doc,NodeType type)

{
  Lexer *lexer_00;
  Node *pNVar1;
  Node *node;
  Lexer *lexer;
  NodeType type_local;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  pNVar1 = prvTidyNewNode(lexer_00->allocator,lexer_00);
  pNVar1->type = type;
  pNVar1->start = lexer_00->txtstart;
  pNVar1->end = lexer_00->txtend;
  return pNVar1;
}

Assistant:

static Node* NewToken(TidyDocImpl* doc, NodeType type)
{
    Lexer* lexer = doc->lexer;
    Node* node = TY_(NewNode)(lexer->allocator, lexer);
    node->type = type;
    node->start = lexer->txtstart;
    node->end = lexer->txtend;
    return node;
}